

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void detachFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  long lVar1;
  sqlite3 *db;
  Db *pDVar2;
  Btree *p;
  int iVar3;
  uchar *puVar4;
  uchar *zRight;
  char *zFormat;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  char zErr [128];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar4 = sqlite3_value_text(*argv);
  db = context->pOut->db;
  zRight = "";
  if (puVar4 != (uchar *)0x0) {
    zRight = puVar4;
  }
  uVar6 = 0;
  uVar5 = (ulong)(uint)db->nDb;
  if (db->nDb < 1) {
    uVar5 = uVar6;
  }
  uVar7 = 0;
  do {
    if (uVar5 == uVar7) {
      zFormat = "no such database: %s";
LAB_0026a8fb:
      sqlite3_snprintf(0x80,zErr,zFormat,zRight);
LAB_0026a910:
      sqlite3_result_error(context,zErr,-1);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
LAB_0026a9a1:
      __stack_chk_fail();
    }
    pDVar2 = db->aDb;
    p = *(Btree **)((long)&pDVar2->pBt + uVar6);
    if (p != (Btree *)0x0) {
      iVar3 = sqlite3StrICmp(*(char **)((long)&pDVar2->zDbSName + uVar6),(char *)zRight);
      if (iVar3 == 0) {
        if (uVar7 < 2) {
          zFormat = "cannot detach database %s";
          goto LAB_0026a8fb;
        }
        if (db->autoCommit == '\0') {
          sqlite3_snprintf(0x80,zErr,"cannot DETACH database within transaction");
          goto LAB_0026a910;
        }
        if ((p->inTrans != '\0') || (p->nBackup != 0)) {
          zFormat = "database %s is locked";
          goto LAB_0026a8fb;
        }
        sqlite3BtreeClose(p);
        *(undefined8 *)((long)&pDVar2->pBt + uVar6) = 0;
        *(undefined8 *)((long)&pDVar2->pSchema + uVar6) = 0;
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          sqlite3CollapseDatabaseArray(db);
          return;
        }
        goto LAB_0026a9a1;
      }
    }
    uVar7 = uVar7 + 1;
    uVar6 = uVar6 + 0x20;
  } while( true );
}

Assistant:

static void detachFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  const char *zName = (const char *)sqlite3_value_text(argv[0]);
  sqlite3 *db = sqlite3_context_db_handle(context);
  int i;
  Db *pDb = 0;
  char zErr[128];

  UNUSED_PARAMETER(NotUsed);

  if( zName==0 ) zName = "";
  for(i=0; i<db->nDb; i++){
    pDb = &db->aDb[i];
    if( pDb->pBt==0 ) continue;
    if( sqlite3StrICmp(pDb->zDbSName, zName)==0 ) break;
  }

  if( i>=db->nDb ){
    sqlite3_snprintf(sizeof(zErr),zErr, "no such database: %s", zName);
    goto detach_error;
  }
  if( i<2 ){
    sqlite3_snprintf(sizeof(zErr),zErr, "cannot detach database %s", zName);
    goto detach_error;
  }
  if( !db->autoCommit ){
    sqlite3_snprintf(sizeof(zErr), zErr,
                     "cannot DETACH database within transaction");
    goto detach_error;
  }
  if( sqlite3BtreeIsInReadTrans(pDb->pBt) || sqlite3BtreeIsInBackup(pDb->pBt) ){
    sqlite3_snprintf(sizeof(zErr),zErr, "database %s is locked", zName);
    goto detach_error;
  }

  sqlite3BtreeClose(pDb->pBt);
  pDb->pBt = 0;
  pDb->pSchema = 0;
  sqlite3CollapseDatabaseArray(db);
  return;

detach_error:
  sqlite3_result_error(context, zErr, -1);
}